

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

void __thiscall UnionType::print(UnionType *this)

{
  string *Str;
  long *in_RDI;
  raw_ostream *this_00;
  raw_ostream local_28 [40];
  
  Str = (string *)llvm::outs();
  this_00 = local_28;
  (**(code **)(*in_RDI + 0x18))();
  llvm::raw_ostream::operator<<(this_00,Str);
  std::__cxx11::string::~string((string *)local_28);
  return;
}

Assistant:

void UnionType::print() const {
    llvm::outs() << toString();
}